

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O1

void __thiscall Handler::Migrate(Handler *this)

{
  pointer pPVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  Handler *this_00;
  LOCATION LVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  pointer pPVar10;
  __normal_iterator<PurchasedServer_*,_std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>_>
  __i;
  pointer pPVar11;
  uint32_t *deployedVMIdx;
  uint uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  allocator_type local_79;
  Handler *local_78;
  ulong local_70;
  ulong local_68;
  uint32_t *local_60;
  ulong local_58;
  pointer local_50;
  uint32_t *local_48;
  uint32_t *local_40;
  
  uVar12 = this->deployedVMNum * 3;
  if (99 < uVar12) {
    pPVar1 = (this->purchasedServers).
             super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar10 = (this->purchasedServers).
              super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_78 = this;
    if (pPVar1 != pPVar10) {
      uVar6 = ((long)pPVar10 - (long)pPVar1 >> 3) * -0x71c71c71c71c71c7;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Handler::Migrate()::__0>>
                (pPVar1,pPVar10,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pPVar10 - (long)pPVar1 < 0x481) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,__gnu_cxx::__ops::_Iter_comp_iter<Handler::Migrate()::__0>>
                  (pPVar1,pPVar10);
      }
      else {
        pPVar11 = pPVar1 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,__gnu_cxx::__ops::_Iter_comp_iter<Handler::Migrate()::__0>>
                  (pPVar1,pPVar11);
        for (; pPVar11 != pPVar10; pPVar11 = pPVar11 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,__gnu_cxx::__ops::_Val_comp_iter<Handler::Migrate()::__0>>
                    (pPVar11);
        }
      }
    }
    pPVar1 = (local_78->purchasedServers).
             super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = ((uint)(*(int *)&(local_78->purchasedServers).
                             super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (int)pPVar1) >> 3) *
            0x38e38e39 & 0xffff;
    if (uVar7 != 0) {
      uVar6 = 0;
      pPVar10 = pPVar1;
      do {
        local_78->purchasedServerIdxMap[pPVar10->id] = (uint16_t)uVar6;
        uVar6 = uVar6 + 1;
        pPVar10 = pPVar10 + 1;
      } while (uVar7 != uVar6);
    }
    uVar7 = (int)((long)(local_78->purchasedServers).
                        super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) * 0x38e38e39;
    if ((int)uVar7 < 1) {
      uVar12 = 0;
    }
    else {
      local_58 = (ulong)uVar12 / 100;
      uVar6 = (ulong)(uVar7 & 0x7fffffff);
      uVar12 = 0;
      bVar4 = false;
      do {
        this_00 = local_78;
        uVar8 = uVar6 - 1;
        pPVar1 = (local_78->purchasedServers).
                 super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_70 = uVar8;
        local_68 = uVar6;
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<std::__detail::_Node_iterator<unsigned_int,true,false>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_48,
                   (_Node_iterator<unsigned_int,_true,_false>)
                   pPVar1[uVar8].deployedVM._M_h._M_before_begin._M_nxt,
                   (_Node_iterator<unsigned_int,_true,_false>)0x0,&local_79);
        SortDeployedVM(this_00,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
        local_60 = local_40;
        uVar6 = local_70;
        if (local_48 != local_40) {
          local_50 = pPVar1 + uVar8;
          deployedVMIdx = local_48;
          bVar3 = bVar4;
          do {
            uVar7 = uVar12;
            bVar4 = bVar3;
            if (!bVar3) {
              uVar8 = 0;
              while (uVar7 = uVar12, bVar4 = bVar3, (long)uVar8 < (long)uVar6) {
                uVar9 = (uint)((int)uVar6 + (int)uVar8) >> 1;
                LVar5 = Migrate(local_78,local_50,
                                (local_78->purchasedServers).
                                super__Vector_base<PurchasedServer,_std::allocator<PurchasedServer>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar9,deployedVMIdx);
                bVar4 = true;
                if (uVar12 + 1 < (uint)local_58) {
                  bVar4 = bVar3;
                }
                uVar6 = local_70;
                uVar7 = uVar12 + 1;
                if (LVar5 != NONE) break;
                uVar8 = (ulong)(uVar9 + 1);
              }
            }
            uVar12 = uVar7;
          } while ((!bVar3) &&
                  (deployedVMIdx = deployedVMIdx + 1, bVar3 = bVar4, deployedVMIdx != local_60));
        }
        if (local_48 != (uint32_t *)0x0) {
          operator_delete(local_48);
        }
      } while ((1 < (long)local_68) && (!bVar4));
    }
    local_78->totalMigrationNum = local_78->totalMigrationNum + uVar12;
  }
  return;
}

Assistant:

void Handler::Migrate() {
    uint32_t threshold = deployedVMNum * 3u / 100u;
    uint32_t migrateNum = 0u;
    bool ended = (migrateNum >= threshold);
    if (ended) return;

    // 将 purchasedServers 按照剩余容量升序排列
    std::sort(purchasedServers.begin(), purchasedServers.end(), [](const PurchasedServer &a, const PurchasedServer &b) {
        return a.vacancyRate != b.vacancyRate ? a.vacancyRate < b.vacancyRate :
               a.remainCpuCoreA + a.remainCpuCoreB + a.remainMemorySizeA + a.remainMemorySizeB <
               b.remainCpuCoreA + b.remainCpuCoreB + b.remainMemorySizeA + b.remainMemorySizeB;;
    });
    // 排序后需要重新映射 purchasedServer id -> purchasedServers index
    ReMapPurchasedServerIdx();

    // originPurchasedServer -> destPurchasedServer
    for (int i = (int) purchasedServers.size() - 1; i >= 0 && !ended; --i) {
        PurchasedServer &originPurchasedServer = purchasedServers[i];
        std::unordered_set<uint32_t> &deployedVM = originPurchasedServer.deployedVM;
        std::vector<uint32_t> tmp(deployedVM.begin(), deployedVM.end());
        SortDeployedVM(tmp);

        for (const uint32_t &deployedVMIdx : tmp) {
            if (ended) break;

            int left = 0, right = i, mid;
            while (left < right) {
                mid = (left + right) / 2;
                PurchasedServer &destPurchasedServer = purchasedServers[mid];
                if (Migrate(originPurchasedServer, destPurchasedServer, deployedVMIdx) != NONE) {
                    if (++migrateNum >= threshold) ended = true;
                    break;
                } else {
                    left = mid + 1;
                }
            }
        }
    }

#ifdef TEST
    totalMigrationNum += migrateNum;
#endif
}